

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_reader.c
# Opt level: O0

rfc5444_result
schedule_end_message_cbs
          (rfc5444_reader_tlvblock_context *tlv_context,rfc5444_reader_tlvblock_consumer *first,
          rfc5444_reader_tlvblock_consumer *last,rfc5444_result result)

{
  rfc5444_result rVar1;
  list_entity *__tempptr;
  rfc5444_reader_tlvblock_consumer *prStack_30;
  rfc5444_result r;
  rfc5444_reader_tlvblock_consumer *consumer;
  rfc5444_result result_local;
  rfc5444_reader_tlvblock_consumer *last_local;
  rfc5444_reader_tlvblock_consumer *first_local;
  rfc5444_reader_tlvblock_context *tlv_context_local;
  
  tlv_context->type = RFC5444_CONTEXT_MESSAGE;
  prStack_30 = last;
  consumer._4_4_ = result;
  while ((rfc5444_reader_tlvblock_consumer *)(prStack_30->_node).list.next != first) {
    if (((prStack_30->end_callback !=
          (_func_rfc5444_result_rfc5444_reader_tlvblock_context_ptr__Bool *)0x0) &&
        ((prStack_30->addrblock_consumer & 1U) == 0)) &&
       (((prStack_30->default_msg_consumer & 1U) != 0 ||
        (prStack_30->msg_id == tlv_context->msg_type)))) {
      tlv_context->consumer = prStack_30;
      rVar1 = (*prStack_30->end_callback)(tlv_context,consumer._4_4_ != RFC5444_OKAY);
      if (consumer._4_4_ < rVar1) {
        consumer._4_4_ = rVar1;
      }
    }
    prStack_30 = (rfc5444_reader_tlvblock_consumer *)(prStack_30->_node).list.prev;
  }
  return consumer._4_4_;
}

Assistant:

static enum rfc5444_result
schedule_end_message_cbs(struct rfc5444_reader_tlvblock_context *tlv_context,
  struct rfc5444_reader_tlvblock_consumer *first, struct rfc5444_reader_tlvblock_consumer *last,
  enum rfc5444_result result) {
  struct rfc5444_reader_tlvblock_consumer *consumer;
  enum rfc5444_result r;

  tlv_context->type = RFC5444_CONTEXT_MESSAGE;

  avl_for_element_range_reverse(first, last, consumer, _node) {
    if (consumer->end_callback && !consumer->addrblock_consumer &&
        (consumer->default_msg_consumer || consumer->msg_id == tlv_context->msg_type)) {
      tlv_context->consumer = consumer;
      r = consumer->end_callback(tlv_context, result != RFC5444_OKAY);
      if (r > result) {
        result = r;
      }
    }
  }
  return result;
}